

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

int TranslateFFSType2ADIOS(char *Type,int size)

{
  int iVar1;
  int in_ESI;
  char *in_RDI;
  
  iVar1 = strcmp(in_RDI,"integer");
  if (iVar1 == 0) {
    if (in_ESI == 1) {
      return 1;
    }
    if (in_ESI == 2) {
      return 2;
    }
    if (in_ESI == 4) {
      return 3;
    }
    if (in_ESI == 8) {
      return 4;
    }
  }
  else {
    iVar1 = strcmp(in_RDI,"unsigned integer");
    if (iVar1 == 0) {
      if (in_ESI == 1) {
        return 5;
      }
      if (in_ESI == 2) {
        return 6;
      }
      if (in_ESI == 4) {
        return 7;
      }
      if (in_ESI == 8) {
        return 8;
      }
    }
    else {
      iVar1 = strcmp(in_RDI,"double");
      if ((iVar1 == 0) || (iVar1 = strcmp(in_RDI,"float"), iVar1 == 0)) {
        if (in_ESI == 4) {
          return 9;
        }
        if (in_ESI == 0x10) {
          return 10;
        }
        return 10;
      }
      iVar1 = strcmp(in_RDI,"complex4");
      if (iVar1 == 0) {
        return 0xc;
      }
      iVar1 = strcmp(in_RDI,"complex8");
      if (iVar1 == 0) {
        return 0xd;
      }
    }
  }
  return 0;
}

Assistant:

static int TranslateFFSType2ADIOS(const char *Type, int size)
{
    if (strcmp(Type, "integer") == 0)
    {
        if (size == 1)
        {
            return Int8;
        }
        else if (size == 2)
        {
            return Int16;
        }
        else if (size == 4)
        {
            return Int32;
        }
        else if (size == 8)
        {
            return Int64;
        }
    }
    else if (strcmp(Type, "unsigned integer") == 0)
    {
        if (size == 1)
        {
            return UInt8;
        }
        else if (size == 2)
        {
            return UInt16;
        }
        else if (size == 4)
        {
            return UInt32;
        }
        else if (size == 8)
        {
            return UInt64;
        }
    }
    else if ((strcmp(Type, "double") == 0) || (strcmp(Type, "float") == 0))
    {
        if (size == sizeof(float))
        {
            return Float;
        }
        else if ((sizeof(long double) != sizeof(double)) && (size == sizeof(long double)))
        {
            return Double;
        }
        else
        {
            return Double;
        }
    }
    else if (strcmp(Type, "complex4") == 0)
    {
        return FloatComplex;
    }
    else if (strcmp(Type, "complex8") == 0)
    {
        return DoubleComplex;
    }
    return 0;
}